

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O1

QPDFMatrix * __thiscall
QPDFPageObjectHelper::getMatrixForFormXObjectPlacement
          (QPDFMatrix *__return_storage_ptr__,QPDFPageObjectHelper *this,QPDFObjectHandle *fo,
          Rectangle rect,bool invert_transformations,bool allow_shrink,bool allow_expand)

{
  Rectangle r;
  Rectangle r_00;
  bool bVar1;
  double dVar2;
  Rectangle T;
  QPDFObjectHandle fdict;
  QPDFMatrix wmatrix;
  QPDFObjectHandle bbox_obj;
  Rectangle bbox;
  QPDFMatrix fmatrix;
  QPDFMatrix tmatrix;
  double local_1c0;
  Rectangle local_1b8;
  QPDFMatrix local_198;
  undefined1 local_168 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  double local_148;
  double dStack_140;
  double local_138;
  double dStack_130;
  QPDFObjectHandle local_128;
  Matrix local_118;
  double local_e8;
  double local_e0;
  double local_d8;
  double *local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  QPDFObjectHandle local_a8;
  QPDFMatrix local_98;
  QPDFMatrix local_68;
  
  QPDFObjectHandle::getDict((QPDFObjectHandle *)local_168);
  local_158._M_allocated_capacity = (size_type)&local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_168 + 0x10),"/BBox","");
  QPDFObjectHandle::getKey(&local_128,(string *)local_168);
  if ((double *)local_158._M_allocated_capacity != &local_148) {
    operator_delete((void *)local_158._M_allocated_capacity,(long)local_148 + 1);
  }
  bVar1 = QPDFObjectHandle::isRectangle(&local_128);
  if (!bVar1) {
    QPDFMatrix::QPDFMatrix(__return_storage_ptr__);
    goto LAB_001d96bb;
  }
  QPDFMatrix::QPDFMatrix((QPDFMatrix *)(local_168 + 0x10));
  QPDFMatrix::QPDFMatrix(&local_68);
  QPDFMatrix::QPDFMatrix(&local_98);
  if (invert_transformations) {
    getMatrixForTransformations(&local_118,this,true);
    QPDFMatrix::QPDFMatrix(&local_198,&local_118);
    local_68.e = local_198.e;
    local_68.f = local_198.f;
    local_68.c = local_198.c;
    local_68.d = local_198.d;
    local_68.a = local_198.a;
    local_68.b = local_198.b;
    QPDFMatrix::concat((QPDFMatrix *)(local_168 + 0x10),&local_68);
  }
  local_198.a = (double)&local_198.c;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"/Matrix","");
  QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_118,(string *)local_168);
  bVar1 = QPDFObjectHandle::isMatrix((QPDFObjectHandle *)&local_118);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118.b !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118.b);
  }
  if ((double *)local_198.a != &local_198.c) {
    operator_delete((void *)local_198.a,(long)local_198.c + 1);
  }
  if (bVar1) {
    local_1b8.llx = (double)&local_1b8.urx;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"/Matrix","");
    QPDFObjectHandle::getKey(&local_a8,(string *)local_168);
    QPDFObjectHandle::getArrayAsMatrix(&local_118,&local_a8);
    QPDFMatrix::QPDFMatrix(&local_198,&local_118);
    local_98.e = local_198.e;
    local_98.f = local_198.f;
    local_98.c = local_198.c;
    local_98.d = local_198.d;
    local_98.a = local_198.a;
    local_98.b = local_198.b;
    if (local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a8.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if ((double *)local_1b8.llx != &local_1b8.urx) {
      operator_delete((void *)local_1b8.llx,(long)local_1b8.urx + 1);
    }
    QPDFMatrix::concat((QPDFMatrix *)(local_168 + 0x10),&local_98);
  }
  QPDFObjectHandle::getArrayAsRectangle((Rectangle *)&local_118,&local_128);
  r.lly = local_118.b;
  r.llx = local_118.a;
  r.urx = local_118.c;
  r.ury = local_118.d;
  QPDFMatrix::transformRectangle(&local_1b8,(QPDFMatrix *)(local_168 + 0x10),r);
  if (((local_1b8.urx == local_1b8.llx) && (!NAN(local_1b8.urx) && !NAN(local_1b8.llx))) ||
     ((local_1b8.ury == local_1b8.lly && (!NAN(local_1b8.ury) && !NAN(local_1b8.lly))))) {
    QPDFMatrix::QPDFMatrix(__return_storage_ptr__);
    goto LAB_001d96bb;
  }
  local_b0 = rect.urx;
  local_c0 = rect.llx;
  local_b8 = rect.ury;
  local_c8 = rect.lly;
  local_1c0 = (rect.urx - rect.llx) / (local_1b8.urx - local_1b8.llx);
  dVar2 = (rect.ury - rect.lly) / (local_1b8.ury - local_1b8.lly);
  if (dVar2 <= local_1c0) {
    local_1c0 = dVar2;
  }
  if (local_1c0 <= 1.0) {
    if (local_1c0 < 1.0 && !allow_shrink) goto LAB_001d9782;
  }
  else if (!allow_expand) {
LAB_001d9782:
    local_1c0 = 1.0;
  }
  QPDFMatrix::QPDFMatrix(&local_198);
  local_138 = local_198.e;
  dStack_130 = local_198.f;
  local_148 = local_198.c;
  dStack_140 = local_198.d;
  local_158._M_allocated_capacity = (size_type)local_198.a;
  local_158._8_8_ = local_198.b;
  QPDFMatrix::scale((QPDFMatrix *)(local_168 + 0x10),local_1c0,local_1c0);
  QPDFMatrix::concat((QPDFMatrix *)(local_168 + 0x10),&local_68);
  QPDFMatrix::concat((QPDFMatrix *)(local_168 + 0x10),&local_98);
  r_00.lly = local_118.b;
  r_00.llx = local_118.a;
  r_00.urx = local_118.c;
  r_00.ury = local_118.d;
  QPDFMatrix::transformRectangle((Rectangle *)&local_198,(QPDFMatrix *)(local_168 + 0x10),r_00);
  local_1b8.urx = local_198.c;
  local_1b8.ury = local_198.d;
  local_1b8.llx = local_198.a;
  local_1b8.lly = local_198.b;
  local_d0 = (double *)local_198.a;
  local_e0 = local_198.b;
  local_d8 = local_198.c;
  local_e8 = local_198.d;
  QPDFMatrix::QPDFMatrix(__return_storage_ptr__);
  QPDFMatrix::translate
            (__return_storage_ptr__,
             (local_b0 + local_c0) * 0.5 - ((double)local_d0 + local_d8) * 0.5,
             (local_b8 + local_c8) * 0.5 - (local_e0 + local_e8) * 0.5);
  QPDFMatrix::scale(__return_storage_ptr__,local_1c0,local_1c0);
  QPDFMatrix::concat(__return_storage_ptr__,&local_68);
LAB_001d96bb:
  if (local_128.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_128.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

QPDFMatrix
QPDFPageObjectHelper::getMatrixForFormXObjectPlacement(
    QPDFObjectHandle fo,
    QPDFObjectHandle::Rectangle rect,
    bool invert_transformations,
    bool allow_shrink,
    bool allow_expand)
{
    // Calculate the transformation matrix that will place the given form XObject fully inside the
    // given rectangle, center and shrinking or expanding as needed if requested.

    // When rendering a form XObject, the transformation in the graphics state (cm) is applied first
    // (of course -- when it is applied, the PDF interpreter doesn't even know we're going to be
    // drawing a form XObject yet), and then the object's matrix (M) is applied. The resulting
    // matrix, when applied to the form XObject's bounding box, will generate a new rectangle. We
    // want to create a transformation matrix that make the form XObject's bounding box land in
    // exactly the right spot.

    QPDFObjectHandle fdict = fo.getDict();
    QPDFObjectHandle bbox_obj = fdict.getKey("/BBox");
    if (!bbox_obj.isRectangle()) {
        return {};
    }

    QPDFMatrix wmatrix; // work matrix
    QPDFMatrix tmatrix; // "to" matrix
    QPDFMatrix fmatrix; // "from" matrix
    if (invert_transformations) {
        // tmatrix inverts scaling and rotation of the destination page. Applying this matrix allows
        // the overlaid form XObject's to be absolute rather than relative to properties of the
        // destination page. tmatrix is part of the computed transformation matrix.
        tmatrix = QPDFMatrix(getMatrixForTransformations(true));
        wmatrix.concat(tmatrix);
    }
    if (fdict.getKey("/Matrix").isMatrix()) {
        // fmatrix is the transformation matrix that is applied to the form XObject itself. We need
        // this for calculations, but we don't explicitly use it in the final result because the PDF
        // rendering system automatically applies this last before
        // drawing the form XObject.
        fmatrix = QPDFMatrix(fdict.getKey("/Matrix").getArrayAsMatrix());
        wmatrix.concat(fmatrix);
    }

    // The current wmatrix handles transformation from the form xobject and, if requested, the
    // destination page. Next, we have to adjust this for scale and position.

    // Step 1: figure out what scale factor we need to make the form XObject's bounding box fit
    // within the destination rectangle.

    // Transform bounding box
    QPDFObjectHandle::Rectangle bbox = bbox_obj.getArrayAsRectangle();
    QPDFObjectHandle::Rectangle T = wmatrix.transformRectangle(bbox);

    // Calculate a scale factor, if needed. Shrink or expand if needed and allowed.
    if ((T.urx == T.llx) || (T.ury == T.lly)) {
        // avoid division by zero
        return {};
    }
    double rect_w = rect.urx - rect.llx;
    double rect_h = rect.ury - rect.lly;
    double t_w = T.urx - T.llx;
    double t_h = T.ury - T.lly;
    double xscale = rect_w / t_w;
    double yscale = rect_h / t_h;
    double scale = (xscale < yscale ? xscale : yscale);
    if (scale > 1.0) {
        if (!allow_expand) {
            scale = 1.0;
        }
    } else if (scale < 1.0) {
        if (!allow_shrink) {
            scale = 1.0;
        }
    }

    // Step 2: figure out what translation is required to get the rectangle to the right spot:
    // centered within the destination.
    wmatrix = QPDFMatrix();
    wmatrix.scale(scale, scale);
    wmatrix.concat(tmatrix);
    wmatrix.concat(fmatrix);

    T = wmatrix.transformRectangle(bbox);
    double t_cx = (T.llx + T.urx) / 2.0;
    double t_cy = (T.lly + T.ury) / 2.0;
    double r_cx = (rect.llx + rect.urx) / 2.0;
    double r_cy = (rect.lly + rect.ury) / 2.0;
    double tx = r_cx - t_cx;
    double ty = r_cy - t_cy;

    // Now we can calculate the final matrix. The final matrix does not include fmatrix because that
    // is applied automatically by the PDF interpreter.
    QPDFMatrix cm;
    cm.translate(tx, ty);
    cm.scale(scale, scale);
    cm.concat(tmatrix);
    return cm;
}